

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

int __thiscall CompoundExp::eval(CompoundExp *this,EvalState *state)

{
  EvalState *this_00;
  bool bVar1;
  int iVar2;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  int local_c8;
  int local_c4;
  int right;
  int left;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  int local_58;
  int val;
  allocator local_41;
  string local_40 [32];
  EvalState *local_20;
  EvalState *state_local;
  CompoundExp *this_local;
  
  local_20 = state;
  state_local = (EvalState *)this;
  bVar1 = std::operator==(&this->op,"=");
  if (bVar1) {
    iVar2 = (*this->lhs->_vptr_Expression[4])();
    if (iVar2 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"SYNTAX ERROR",&local_41);
      error((string *)local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    local_58 = (*this->rhs->_vptr_Expression[2])(this->rhs,local_20);
    (*this->lhs->_vptr_Expression[3])();
    bVar1 = check_reserve(local_78);
    std::__cxx11::string::~string((string *)local_78);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"SYNTAX ERROR",&local_99);
      error((string *)local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    this_00 = local_20;
    IdentifierExp::getName_abi_cxx11_((IdentifierExp *)&right);
    EvalState::setValue(this_00,(string *)&right,local_58);
    std::__cxx11::string::~string((string *)&right);
    this_local._4_4_ = local_58;
  }
  else {
    local_c4 = (*this->lhs->_vptr_Expression[2])(this->lhs,local_20);
    local_c8 = (*this->rhs->_vptr_Expression[2])(this->rhs,local_20);
    bVar1 = std::operator==(&this->op,"+");
    if (bVar1) {
      this_local._4_4_ = local_c4 + local_c8;
    }
    else {
      bVar1 = std::operator==(&this->op,"-");
      if (bVar1) {
        this_local._4_4_ = local_c4 - local_c8;
      }
      else {
        bVar1 = std::operator==(&this->op,"*");
        if (bVar1) {
          this_local._4_4_ = local_c4 * local_c8;
        }
        else {
          bVar1 = std::operator==(&this->op,"/");
          if (bVar1) {
            if (local_c8 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_e8,"DIVIDE BY ZERO",&local_e9);
              error((string *)local_e8);
              std::__cxx11::string::~string(local_e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            }
            this_local._4_4_ = local_c4 / local_c8;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_110,"SYNTAX ERROR",&local_111);
            error((string *)local_110);
            std::__cxx11::string::~string(local_110);
            std::allocator<char>::~allocator((allocator<char> *)&local_111);
            this_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int CompoundExp::eval(EvalState & state) {
   if (op == "=") {
      if (lhs->getType() != IDENTIFIER) {
         error("SYNTAX ERROR");
      }
      int val = rhs->eval(state);
      if (check_reserve(lhs->toString())) error("SYNTAX ERROR");
      state.setValue(((IdentifierExp *) lhs)->getName(), val);
      return val;
   }
   int left = lhs->eval(state);
   int right = rhs->eval(state);
   if (op == "+") return left + right;
   if (op == "-") return left - right;
   if (op == "*") return left * right;
   if (op == "/") {
       if (right==0) error("DIVIDE BY ZERO");
       return left / right;
   }
   error("SYNTAX ERROR");
   return 0;
}